

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Bitvec * unqliteBitvecCreate(SyMemBackend *pAlloc,pgno iSize)

{
  SyMemBlock *pSrc;
  Bitvec *p;
  bitvec_rec **apNew;
  pgno iSize_local;
  SyMemBackend *pAlloc_local;
  
  pAlloc_local = (SyMemBackend *)SyMemBackendAlloc(pAlloc,0x20);
  if (pAlloc_local == (SyMemBackend *)0x0) {
    pAlloc_local = (SyMemBackend *)0x0;
  }
  else {
    SyZero(pAlloc_local,0x20);
    *(undefined4 *)((long)&pAlloc_local->pMethods + 4) = 0x40;
    pSrc = (SyMemBlock *)SyMemBackendAlloc(pAlloc,*(int *)((long)&pAlloc_local->pMethods + 4) << 3);
    if (pSrc == (SyMemBlock *)0x0) {
      SyMemBackendFree(pAlloc,pAlloc_local);
      pAlloc_local = (SyMemBackend *)0x0;
    }
    else {
      SyZero(pSrc,*(int *)((long)&pAlloc_local->pMethods + 4) << 3);
      pAlloc_local->pBlocks = pSrc;
      pAlloc_local->pMutexMethods = (SyMutexMethods *)pAlloc;
    }
  }
  return (Bitvec *)pAlloc_local;
}

Assistant:

UNQLITE_PRIVATE Bitvec * unqliteBitvecCreate(SyMemBackend *pAlloc,pgno iSize)
{
	bitvec_rec **apNew;
	Bitvec *p;
	
	p = (Bitvec *)SyMemBackendAlloc(pAlloc,sizeof(*p) );
	if( p == 0 ){
		SXUNUSED(iSize); /* cc warning */
		return 0;
	}
	/* Zero the structure */
	SyZero(p,sizeof(Bitvec));
	/* Allocate a new table */
	p->nSize = 64; /* Must be a power of two */
	apNew = (bitvec_rec **)SyMemBackendAlloc(pAlloc,p->nSize * sizeof(bitvec_rec *));
	if( apNew == 0 ){
		SyMemBackendFree(pAlloc,p);
		return 0;
	}
	/* Zero the new table */
	SyZero((void *)apNew,p->nSize * sizeof(bitvec_rec *));
	/* Fill-in */
	p->apRec = apNew;
	p->pAlloc = pAlloc;
	return p;
}